

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexWrapper.hpp
# Opt level: O1

IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> * __thiscall
Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>::operator=
          (IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag> *this,uchar *Value)

{
  IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag> IVar1;
  uchar *in_RCX;
  string msg;
  string local_30;
  
  IVar1 = (IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>)*Value;
  *this = IVar1;
  if (IVar1 != (IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>)*Value) {
    FormatString<char[32],unsigned_char>
              (&local_30,(Diligent *)"Not enough bits to store value ",(char (*) [32])Value,in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator=",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/IndexWrapper.hpp"
               ,0x46);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)this;
}

Assistant:

IndexWrapper& operator=(const T& Value)
    {
        m_Value = static_cast<IndexType>(Value);
        VERIFY(static_cast<T>(m_Value) == Value, "Not enough bits to store value ", Value);
        return *this;
    }